

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O2

void ballfall(void)

{
  uint uVar1;
  char *pcVar2;
  int n;
  bool bVar3;
  
  if (uball->ox == u.ux) {
    bVar3 = true;
    if ((uball->oy == u.uy) || (uwep == uball)) goto LAB_0014f587;
  }
  else if (uwep == uball) {
    bVar3 = true;
    goto LAB_0014f587;
  }
  uVar1 = mt_random();
  bVar3 = uVar1 % 5 == 0;
LAB_0014f587:
  if (uball->where == '\x03') {
    pline("Startled, you drop the iron ball.");
    if (uwep == uball) {
      setuwep((obj *)0x0);
    }
    if (uswapwep == uball) {
      setuswapwep((obj *)0x0);
    }
    if (uquiver == uball) {
      setuqwep((obj *)0x0);
    }
    if (uwep != uball) {
      freeinv(uball);
    }
  }
  if (!bVar3) {
    uVar1 = mt_random();
    n = uVar1 % 7 + 0x19;
    pcVar2 = body_part(8);
    pline("The iron ball falls on your %s.",pcVar2);
    if (uarmh != (obj *)0x0) {
      if ((ushort)((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7) {
        pline("Fortunately, you are wearing a hard helmet.");
        n = 3;
      }
      else if (flags.verbose != '\0') {
        pcVar2 = xname(uarmh);
        pline("Your %s does not protect you.",pcVar2);
      }
    }
    losehp(n,"crunched in the head by an iron ball",2);
    return;
  }
  return;
}

Assistant:

void ballfall(void)
{
	boolean gets_hit;

	gets_hit = (((uball->ox != u.ux) || (uball->oy != u.uy)) &&
		    ((uwep == uball)? FALSE : (boolean)rn2(5)));
	if (carried(uball)) {
		pline("Startled, you drop the iron ball.");
		if (uwep == uball)
			setuwep(NULL);
		if (uswapwep == uball)
			setuswapwep(NULL);
		if (uquiver == uball)
			setuqwep(NULL);;
		if (uwep != uball)
			freeinv(uball);
	}
	if (gets_hit){
		int dmg = rn1(7,25);
		pline("The iron ball falls on your %s.",
			body_part(HEAD));
		if (uarmh) {
		    if (is_metallic(uarmh)) {
			pline("Fortunately, you are wearing a hard helmet.");
			dmg = 3;
		    } else if (flags.verbose)
			pline("Your %s does not protect you.", xname(uarmh));
		}
		losehp(dmg, "crunched in the head by an iron ball",
			NO_KILLER_PREFIX);
	}
}